

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O0

CURLcode get_libcurl_info(void)

{
  int iVar1;
  proto_name_pattern *local_20;
  proto_name_pattern *p;
  char **proto;
  
  curlinfo = (curl_version_info_data *)curl_version_info(7);
  if (curlinfo == (curl_version_info_data *)0x0) {
    proto._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    built_in_protos = 0;
    if (curlinfo->protocols != (char **)0x0) {
      for (p = (proto_name_pattern *)curlinfo->protocols; p->proto_name != (char *)0x0;
          p = (proto_name_pattern *)&p->proto_pattern) {
        for (local_20 = get_libcurl_info::possibly_built_in; local_20->proto_name != (char *)0x0;
            local_20 = local_20 + 1) {
          iVar1 = curl_strequal(p->proto_name,local_20->proto_name);
          if (iVar1 != 0) {
            built_in_protos = local_20->proto_pattern | built_in_protos;
            break;
          }
        }
      }
    }
    proto._4_4_ = CURLE_OK;
  }
  return proto._4_4_;
}

Assistant:

CURLcode get_libcurl_info(void)
{
  static struct proto_name_pattern {
    const char *proto_name;
    long        proto_pattern;
  } const possibly_built_in[] = {
    { "dict",   CURLPROTO_DICT   },
    { "file",   CURLPROTO_FILE   },
    { "ftp",    CURLPROTO_FTP    },
    { "ftps",   CURLPROTO_FTPS   },
    { "gopher", CURLPROTO_GOPHER },
    { "http",   CURLPROTO_HTTP   },
    { "https",  CURLPROTO_HTTPS  },
    { "imap",   CURLPROTO_IMAP   },
    { "imaps",  CURLPROTO_IMAPS  },
    { "ldap",   CURLPROTO_LDAP   },
    { "ldaps",  CURLPROTO_LDAPS  },
    { "pop3",   CURLPROTO_POP3   },
    { "pop3s",  CURLPROTO_POP3S  },
    { "rtmp",   CURLPROTO_RTMP   },
    { "rtsp",   CURLPROTO_RTSP   },
    { "scp",    CURLPROTO_SCP    },
    { "sftp",   CURLPROTO_SFTP   },
    { "smb",    CURLPROTO_SMB    },
    { "smbs",   CURLPROTO_SMBS   },
    { "smtp",   CURLPROTO_SMTP   },
    { "smtps",  CURLPROTO_SMTPS  },
    { "telnet", CURLPROTO_TELNET },
    { "tftp",   CURLPROTO_TFTP   },
    {  NULL,    0                }
  };

  const char *const *proto;

  /* Pointer to libcurl's run-time version information */
  curlinfo = curl_version_info(CURLVERSION_NOW);
  if(!curlinfo)
    return CURLE_FAILED_INIT;

  /* Build CURLPROTO_* bit pattern with libcurl's built-in protocols */
  built_in_protos = 0;
  if(curlinfo->protocols) {
    for(proto = curlinfo->protocols; *proto; proto++) {
      struct proto_name_pattern const *p;
      for(p = possibly_built_in; p->proto_name; p++) {
        if(curl_strequal(*proto, p->proto_name)) {
          built_in_protos |= p->proto_pattern;
          break;
        }
      }
    }
  }

  return CURLE_OK;
}